

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M_tree.cpp
# Opt level: O3

void __thiscall M_tree::insert_leaf(M_tree *this,string *key,int n)

{
  pointer pcVar1;
  long lVar2;
  pointer ppNVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *pNVar6;
  int iVar7;
  Node *pNVar8;
  undefined8 *puVar9;
  long *plVar10;
  ostream *poVar11;
  value_type this_00;
  long *plVar12;
  Node *this_01;
  uint uVar13;
  pointer pbVar14;
  long lVar15;
  ulong uVar16;
  Node *item;
  hash_add_key result;
  uint32_t newhash [8];
  ifstream file;
  char byte_file [1048576];
  long *plVar17;
  long lVar18;
  long in_stack_ffffffffffeffcd0;
  long in_stack_ffffffffffeffcf0;
  long *plVar19;
  long lVar20;
  undefined8 in_stack_ffffffffffeffd58;
  undefined8 in_stack_ffffffffffeffd60;
  undefined8 in_stack_ffffffffffeffd68;
  undefined8 in_stack_ffffffffffeffd70;
  long in_stack_ffffffffffeffdc0;
  uint32_t in_stack_ffffffffffeffdc8;
  
  if ((n == 1) &&
     (uVar13 = (uint)((ulong)((long)(this->file_names_p).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->file_names_p).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5), 0 < (int)uVar13
     )) {
    lVar15 = 0;
    do {
      iVar7 = std::__cxx11::string::compare((string *)key);
      if (iVar7 < 0) {
        pNVar8 = (Node *)operator_new(0x50);
        (pNVar8->key).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pNVar8->key).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pNVar8->key).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pNVar8->hashn[0] = 0;
        pNVar8->hashn[1] = 0;
        pNVar8->hashn[2] = 0;
        pNVar8->hashn[3] = 0;
        pNVar8->hashn[4] = 0;
        pNVar8->hashn[5] = 0;
        pNVar8->hashn[6] = 0;
        pNVar8->hashn[7] = 0;
        pNVar8->parent = (Node *)0x0;
        pNVar8->left = (Node *)0x0;
        pNVar8->right = (Node *)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)pNVar8,key);
        pcVar1 = (this->folder_name1)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&stack0xffffffffffeffce8,pcVar1,
                   pcVar1 + (this->folder_name1)._M_string_length);
        std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffeffcc8,"/","");
        if (((ulong)(in_stack_ffffffffffeffcd0 + in_stack_ffffffffffeffcf0) < 0x10) ||
           (0xf < (ulong)(in_stack_ffffffffffeffcd0 + in_stack_ffffffffffeffcf0))) {
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             (&stack0xffffffffffeffce8,(ulong)&stack0xffffffffffeffcd8);
        }
        else {
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&stack0xffffffffffeffcc8,0,(char *)0x0,
                              (ulong)&stack0xffffffffffeffcf8);
        }
        plVar17 = (long *)&stack0xffffffffffeffcb8;
        plVar19 = puVar9 + 2;
        if ((long *)*puVar9 == plVar19) {
          lVar18 = *plVar19;
        }
        else {
          lVar18 = *plVar19;
          plVar17 = (long *)*puVar9;
        }
        *puVar9 = plVar19;
        puVar9[1] = 0;
        *(undefined1 *)plVar19 = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    (&stack0xffffffffffeffca8,(ulong)(key->_M_dataplus)._M_p);
        plVar19 = (long *)&stack0xffffffffffeffd18;
        plVar12 = plVar10 + 2;
        if ((long *)*plVar10 == plVar12) {
          lVar20 = *plVar12;
        }
        else {
          lVar20 = *plVar12;
          plVar19 = (long *)*plVar10;
        }
        *plVar10 = (long)plVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::ifstream::ifstream(&stack0xffffffffffeffdc0,(char *)plVar19,_S_in|_S_bin);
        if (plVar19 != (long *)&stack0xffffffffffeffd18) {
          operator_delete(plVar19,lVar20 + 1);
        }
        if (plVar17 != (long *)&stack0xffffffffffeffcb8) {
          operator_delete(plVar17,lVar18 + 1);
        }
        if (((&stack0xffffffffffeffde0)[*(long *)(in_stack_ffffffffffeffdc0 + -0x18)] & 5) == 0) {
          memset(&stack0xffffffffffefffc8,0,0x100000);
          std::istream::read(&stack0xffffffffffeffdc0,(long)&stack0xffffffffffefffc8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"inserting the file: ",0x14);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(key->_M_dataplus)._M_p,key->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          sha256(&stack0xffffffffffefffc8,in_stack_ffffffffffeffdc8,pNVar8->hashn);
          std::ifstream::close();
          ppNVar3 = (this->point_p).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pNVar4 = *(Node **)((long)ppNVar3 + lVar15);
          std::vector<Node_*,_std::allocator<Node_*>_>::insert
                    (&this->point_p,(Node **)((long)ppNVar3 + lVar15),
                     (value_type *)&stack0xffffffffffeffca0);
          this_01 = pNVar4->parent;
          pNVar5 = this_01->left;
          pNVar6 = this_01->right;
          if (pNVar5 == pNVar4) {
            if (pNVar6 == (Node *)0x0) {
              this_01->right = pNVar8;
              goto LAB_00105401;
            }
            if (pNVar5 == (Node *)0x0 && pNVar6 == pNVar4) goto LAB_001053ed;
            this_00 = (value_type)operator_new(0x50);
            this_00->hashn[6] = 0;
            this_00->hashn[7] = 0;
            this_00->parent = (Node *)0x0;
            this_00->hashn[2] = 0;
            this_00->hashn[3] = 0;
            this_00->hashn[4] = 0;
            this_00->hashn[5] = 0;
            (this_00->key).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            this_00->hashn[0] = 0;
            this_00->hashn[1] = 0;
            (this_00->key).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (this_00->key).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            this_00->left = pNVar8;
            this_00->right = pNVar4;
            pNVar8->parent = this_00;
            this_01 = pNVar4->parent;
            pNVar4->parent = this_00;
            this_01->left = this_00;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                       (this_00->left->key).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this_00->left->key).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            pbVar14 = (this_00->right->key).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((this_00->right->key).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != pbVar14) {
              lVar15 = 0;
              uVar16 = 0;
              do {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)this_00,(value_type *)((long)&(pbVar14->_M_dataplus)._M_p + lVar15));
                uVar16 = uVar16 + 1;
                pbVar14 = (this_00->right->key).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                lVar15 = lVar15 + 0x20;
              } while (uVar16 < (ulong)((long)(this_00->right->key).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pbVar14 >> 5));
            }
            sha256(&stack0xffffffffffeffd78,0x40,(uint32_t *)&stack0xffffffffffeffd58);
          }
          else {
            if (pNVar5 == (Node *)0x0 && pNVar6 == pNVar4) {
LAB_001053ed:
              this_01->left = pNVar8;
LAB_00105401:
              pNVar8->parent = this_01;
              goto LAB_00105545;
            }
            this_00 = (value_type)operator_new(0x50);
            this_00->hashn[6] = 0;
            this_00->hashn[7] = 0;
            this_00->parent = (Node *)0x0;
            this_00->hashn[2] = 0;
            this_00->hashn[3] = 0;
            this_00->hashn[4] = 0;
            this_00->hashn[5] = 0;
            (this_00->key).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            this_00->hashn[0] = 0;
            this_00->hashn[1] = 0;
            (this_00->key).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (this_00->key).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            this_00->left = pNVar8;
            this_00->right = pNVar4;
            pNVar8->parent = this_00;
            this_01 = pNVar4->parent;
            pNVar4->parent = this_00;
            this_01->right = this_00;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                       (pNVar8->key).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pNVar8->key).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            pbVar14 = (this_00->right->key).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((this_00->right->key).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != pbVar14) {
              lVar15 = 0;
              uVar16 = 0;
              do {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)this_00,(value_type *)((long)&(pbVar14->_M_dataplus)._M_p + lVar15));
                uVar16 = uVar16 + 1;
                pbVar14 = (this_00->right->key).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                lVar15 = lVar15 + 0x20;
              } while (uVar16 < (ulong)((long)(this_00->right->key).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pbVar14 >> 5));
            }
            sha256(&stack0xffffffffffeffd78,0x40,(uint32_t *)&stack0xffffffffffeffd58);
          }
          *(undefined8 *)(this_00->hashn + 4) = in_stack_ffffffffffeffd68;
          *(undefined8 *)(this_00->hashn + 6) = in_stack_ffffffffffeffd70;
          *(undefined8 *)this_00->hashn = in_stack_ffffffffffeffd58;
          *(undefined8 *)(this_00->hashn + 2) = in_stack_ffffffffffeffd60;
          if (this_01 == (Node *)0x0) goto LAB_001056cc;
LAB_00105545:
          do {
            pNVar8 = this_01->left;
            pNVar4 = this_01->right;
            if (pNVar4 == (Node *)0x0) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         this_01,(pNVar8->key).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                         (pNVar8->key).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
LAB_00105672:
              sha256(&stack0xffffffffffeffd78,0x40,(uint32_t *)&stack0xffffffffffeffd58);
            }
            else {
              if (pNVar8 == (Node *)0x0) {
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           this_01,(pNVar4->key).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                           (pNVar4->key).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
                goto LAB_00105672;
              }
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         this_01,(pNVar8->key).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                         (pNVar8->key).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              pbVar14 = (this_01->right->key).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((this_01->right->key).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish != pbVar14) {
                lVar15 = 0;
                uVar16 = 0;
                do {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&this_01->key,
                              (value_type *)((long)&(pbVar14->_M_dataplus)._M_p + lVar15));
                  uVar16 = uVar16 + 1;
                  pbVar14 = (this_01->right->key).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  lVar15 = lVar15 + 0x20;
                } while (uVar16 < (ulong)((long)(this_01->right->key).
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)pbVar14 >> 5));
              }
              sha256(&stack0xffffffffffeffd78,0x40,(uint32_t *)&stack0xffffffffffeffd58);
            }
            *(undefined8 *)(this_01->hashn + 4) = in_stack_ffffffffffeffd68;
            *(undefined8 *)(this_01->hashn + 6) = in_stack_ffffffffffeffd70;
            *(undefined8 *)this_01->hashn = in_stack_ffffffffffeffd58;
            *(undefined8 *)(this_01->hashn + 2) = in_stack_ffffffffffeffd60;
            this_01 = this_01->parent;
            if (this_01 == (Node *)0x0) {
LAB_001056cc:
              std::ifstream::~ifstream(&stack0xffffffffffeffdc0);
              return;
            }
          } while( true );
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Failed open the file",0x14);
        pcVar1 = (this->folder_name1)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&stack0xffffffffffeffce8,pcVar1,
                   pcVar1 + (this->folder_name1)._M_string_length);
        std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffeffcc8,"/","");
        if (((ulong)(in_stack_ffffffffffeffcd0 + in_stack_ffffffffffeffcf0) < 0x10) ||
           (0xf < (ulong)(in_stack_ffffffffffeffcd0 + in_stack_ffffffffffeffcf0))) {
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             (&stack0xffffffffffeffce8,(ulong)&stack0xffffffffffeffcd8);
        }
        else {
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&stack0xffffffffffeffcc8,0,(char *)0x0,
                              (ulong)&stack0xffffffffffeffcf8);
        }
        plVar17 = (long *)&stack0xffffffffffeffcb8;
        plVar19 = puVar9 + 2;
        if ((long *)*puVar9 == plVar19) {
          lVar18 = *plVar19;
        }
        else {
          lVar18 = *plVar19;
          plVar17 = (long *)*puVar9;
        }
        *puVar9 = plVar19;
        puVar9[1] = 0;
        *(undefined1 *)plVar19 = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    (&stack0xffffffffffeffca8,(ulong)(key->_M_dataplus)._M_p);
        plVar19 = (long *)&stack0xffffffffffeffd18;
        plVar12 = plVar10 + 2;
        if ((long *)*plVar10 == plVar12) {
          lVar20 = *plVar12;
        }
        else {
          lVar20 = *plVar12;
          plVar19 = (long *)*plVar10;
        }
        lVar2 = plVar10[1];
        *plVar10 = (long)plVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)plVar19,lVar2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        if (plVar19 != (long *)&stack0xffffffffffeffd18) {
          operator_delete(plVar19,lVar20 + 1);
        }
        if (plVar17 != (long *)&stack0xffffffffffeffcb8) {
          operator_delete(plVar17,lVar18 + 1);
        }
        std::ifstream::~ifstream(&stack0xffffffffffeffdc0);
      }
      lVar15 = lVar15 + 8;
    } while ((ulong)(uVar13 & 0x7fffffff) << 3 != lVar15);
  }
  return;
}

Assistant:

void M_tree::insert_leaf(string key, int n) {
    char byte_file[1024*1024];
    Node * item;
    Node * item2;
    Node * leaff;
    Node * up;
    uint32_t newhash[8];
    hash_add_key hasha;
    switch (n) {
        case 1:
        {
            int n = file_names_p.size();
            for(int i=0;i<n;i++){
                if(key < file_names_p[i]){
                    // finish insert
                    item = new(Node);
                    item->right = NULL;
                    item->left = NULL;
                    item->key.push_back(key);
                    ifstream file((string(folder_name1)+string("/")+key).c_str(), ios::in | ios::binary);
                    if(!file){
                        cout << "Failed open the file" << string(folder_name1)+string("/")+key << endl;
                        continue;
                    }
                    memset(byte_file, 0, sizeof(byte_file));
                    file.read(reinterpret_cast<char *>(&byte_file), sizeof(byte_file));
                    cout << "inserting the file: " << key << endl;                //output the file names
                    sha256((uint8_t*)byte_file,file.gcount(), item->hashn);
                    file.close();
                    leaff = point_p[i];
                    point_p.insert(point_p.begin()+i, item);
                    if(leaff->parent->left == leaff && leaff->parent->right == NULL){
                        leaff->parent->right = item;
                        item->parent = leaff->parent;
                        item = item->parent;
                    }
                    else if(leaff->parent->right == leaff && leaff->parent->left == NULL){
                        leaff->parent->left = item;
                        item->parent = leaff->parent;
                        item = item->parent;
                    }
                    else{
                        if(leaff->parent->left == leaff){
                            item2 = new(Node);
                            item2->left = item;
                            item2->right = leaff;
                            item->parent = item2;
                            item = item2;
                            item2 = leaff->parent;
                            leaff->parent = item;
                            item2->left = item;
                            int j;
                            item->key.assign(item->left->key.begin(), item->left->key.end());
                            for (j=0;j<item->right->key.size();j++){
                                item->key.push_back(item->right->key[j]);
                            }
                            hasha = add_hash(item->left->hashn, item->right->hashn);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                            item = item2;
                        }
                        else{
                            item2 = new(Node);
                            item2->left = item;
                            item2->right = leaff;
                            item->parent = item2;
                            item = item2;
                            item2 = leaff->parent;
                            leaff->parent = item;
                            item2->right = item;
                            int j;
                            item->key.assign(item->left->key.begin(), item->left->key.end());
                            for (j=0;j<item->right->key.size();j++){
                                item->key.push_back(item->right->key[j]);
                            }
                            hasha = add_hash(item->left->hashn, item->right->hashn);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                            item = item2;
                        }
                    }
                    // start update hash and keys
                    while (item!=NULL){
                        if(item->right == NULL){
                            item->key.assign(item->left->key.begin(), item->left->key.end());
                            memcpy(hasha.ahash2, item->left->hashn, 32);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                        }
                        else if(item->left == NULL){
                            item->key.assign(item->right->key.begin(), item->right->key.end());
                            memcpy(hasha.ahash2, item->right->hashn, 32);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                        }
                        else{
                            int j;
                            item->key.assign(item->left->key.begin(), item->left->key.end());
                            for (j=0;j<item->right->key.size();j++){
                                item->key.push_back(item->right->key[j]);
                            }
                            hasha = add_hash(item->left->hashn, item->right->hashn);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                        }
                        item = item->parent;
                    }
                    return;
                }
            }
            break;
        }
        default:{
            return;
        }
    }
}